

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall polyscope::CurveNetwork::drawPick(CurveNetwork *this)

{
  bool bVar1;
  ShaderProgram *p;
  
  bVar1 = Structure::isEnabled((Structure *)this);
  if (bVar1) {
    p = (this->edgePickProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((p == (ShaderProgram *)0x0) ||
       ((this->nodePickProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      preparePick(this);
      p = (this->edgePickProgram).
          super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    Structure::setStructureUniforms((Structure *)this,p);
    Structure::setStructureUniforms
              ((Structure *)this,
               (this->nodePickProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    setCurveNetworkEdgeUniforms
              (this,(this->edgePickProgram).
                    super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    setCurveNetworkNodeUniforms
              (this,(this->nodePickProgram).
                    super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    (*((this->edgePickProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (*((this->nodePickProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    return;
  }
  return;
}

Assistant:

void CurveNetwork::drawPick() {
  if (!isEnabled()) {
    return;
  }

  // Ensure we have prepared buffers
  if (edgePickProgram == nullptr || nodePickProgram == nullptr) {
    preparePick();
  }

  // Set uniforms
  setStructureUniforms(*edgePickProgram);
  setStructureUniforms(*nodePickProgram);

  setCurveNetworkEdgeUniforms(*edgePickProgram);
  setCurveNetworkNodeUniforms(*nodePickProgram);

  edgePickProgram->draw();
  nodePickProgram->draw();
}